

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

void __thiscall MlmWrap::create(MlmWrap *this,char *_id,char *e)

{
  undefined1 uVar1;
  int iVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ostream *this_00;
  char *in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int retval;
  mlm_client_t *temp;
  network_pimpl *in_stack_fffffffffffffe78;
  network_pimpl *in_stack_fffffffffffffe80;
  allocator *paVar6;
  undefined8 in_stack_fffffffffffffe88;
  string *value;
  mlm_client_t *in_stack_fffffffffffffe90;
  network_pimpl *this_01;
  undefined8 in_stack_fffffffffffffe98;
  int tries;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  uint uVar7;
  MlmWrap *this_02;
  undefined7 in_stack_fffffffffffffeb0;
  string local_128 [39];
  allocator local_101;
  string local_100 [16];
  string *in_stack_ffffffffffffff10;
  MlmWrap *in_stack_ffffffffffffff18;
  network_pimpl *in_stack_ffffffffffffff20;
  string local_c0 [8];
  mlm_client_t *in_stack_ffffffffffffff48;
  MlmWrap *in_stack_ffffffffffffff50;
  string local_a0;
  int local_7c;
  undefined1 local_78 [64];
  string local_38 [32];
  char *local_18;
  
  tries = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  iVar2 = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  local_18 = in_RDX;
  std::__cxx11::string::operator=((string *)&in_RDI->_M_string_length,in_RSI);
  sVar3 = mlm_client_new();
  in_RDI[1].field_2._M_allocated_capacity = sVar3;
  *(undefined8 *)(in_RDI + 2) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_18,(allocator *)(local_78 + 0x3f));
  network_pimpl::setEndpoint(in_stack_fffffffffffffe80,(string *)in_stack_fffffffffffffe78);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)(local_78 + 0x3f));
  in_RDI[4].field_2._M_local_buf[0] = '\0';
  in_RDI[4].field_2._M_local_buf[1] = '\0';
  local_78._32_8_ = mlm_client_new();
  this_02 = (MlmWrap *)local_78;
  network_pimpl::getEndpoint_abi_cxx11_(in_stack_fffffffffffffe78);
  std::__cxx11::string::c_str();
  uVar1 = checkBrokerConnected
                    (this_02,(char *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                     tries,in_stack_fffffffffffffe90,iVar2);
  uVar7 = (uint)(byte)uVar1 << 0x18 ^ 0xff000000;
  std::__cxx11::string::~string((string *)local_78);
  if ((uVar7 & 0x1000000) == 0) {
    verifyID(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    mlm_client_destroy(local_78 + 0x20);
    this_01 = (network_pimpl *)in_RDI[1].field_2._M_allocated_capacity;
    value = &local_a0;
    network_pimpl::getEndpoint_abi_cxx11_(in_stack_fffffffffffffe78);
    uVar4 = std::__cxx11::string::c_str();
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = mlm_client_connect(this_01,uVar4,1000,uVar5);
    std::__cxx11::string::~string((string *)&local_a0);
    local_7c = iVar2;
    network_pimpl::insert_client(this_01,value);
    if (local_7c != 0) {
      mlm_client_destroy(&in_RDI[1].field_2);
      in_RDI[1].field_2._M_allocated_capacity = 0;
      network_pimpl::remove_client(in_stack_ffffffffffffff20,(string *)in_stack_ffffffffffffff18);
      paVar6 = &local_101;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,"Could not create client at the specified address [",paVar6);
      network_pimpl::getEndpoint_abi_cxx11_(in_stack_fffffffffffffe78);
      std::operator+(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,in_stack_fffffffffffffeb0));
      error(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      this_00 = std::operator<<((ostream *)&std::cerr,local_c0);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
    }
  }
  else {
    mlm_client_destroy(&in_RDI[1].field_2);
    in_RDI[1].field_2._M_allocated_capacity = 0;
  }
  return;
}

Assistant:

void MlmWrap::create(const char* _id, const char* e) {
    id = _id;
    client = mlm_client_new();
    actor = NULL;
    state->setEndpoint(e);
    initialized = false;
    connected = false;

    //Verifies broker exists, and finds a valid id to use while temp connected
    //Creates temp once, and passes it to checkBrokerConnected and verifyID, each needs to use temp
    //TODO: does broker and trodes need to go through this step?
    mlm_client_t *temp = mlm_client_new();
    if (!checkBrokerConnected(state->getEndpoint().c_str(), 3, temp)) {
        mlm_client_destroy(&client);
        client = NULL;
        return;
    }
    verifyID(temp);
    mlm_client_destroy(&temp);

    //Creates client with id
    int retval = mlm_client_connect(client, state->getEndpoint().c_str(), 1000, id.c_str());
    state->insert_client(id);
    if (retval != 0) { // if the client failed to be created
        mlm_client_destroy(&client);
        client = NULL;
        state->remove_client(id);
        std::cerr << error(std::string("Could not create client at the specified address [") + state->getEndpoint()) << std::endl;
        return;
    }
}